

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.h
# Opt level: O2

bool __thiscall
ThreadContext::IsOldEntryPointInfo(ThreadContext *this,ProxyEntryPointInfo *entryPointInfo)

{
  FunctionEntryPointInfo *pFVar1;
  RecyclableData *pRVar2;
  Type *pTVar3;
  
  pRVar2 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(&this->recyclableData)
  ;
  pTVar3 = &pRVar2->oldEntryPointInfo;
  do {
    pFVar1 = pTVar3->ptr;
    if (pFVar1 == (FunctionEntryPointInfo *)entryPointInfo) break;
    pTVar3 = &pFVar1->nextEntryPoint;
  } while (pFVar1 != (FunctionEntryPointInfo *)0x0);
  return pFVar1 != (FunctionEntryPointInfo *)0x0;
}

Assistant:

bool IsOldEntryPointInfo(Js::ProxyEntryPointInfo* entryPointInfo)
    {
        Js::FunctionEntryPointInfo* current = this->recyclableData->oldEntryPointInfo;
        while (current != nullptr)
        {
            if (current == entryPointInfo)
                return true;
            current = current->nextEntryPoint;
        }
        return false;
    }